

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afshaper.c
# Opt level: O2

FT_Error af_shaper_get_coverage
                   (AF_FaceGlobals globals,AF_StyleClass style_class,FT_UShort *gstyles,
                   FT_Bool default_script)

{
  byte bVar1;
  hb_tag_t *phVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AF_Blue_StringRec *pAVar8;
  undefined8 uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  byte *pbVar13;
  hb_codepoint_t idx;
  hb_tag_t script_tags [4];
  undefined8 local_70;
  hb_codepoint_t gidx;
  undefined8 local_50;
  AF_StyleClass local_48;
  FT_UShort *local_40;
  AF_Blue_StringRec *local_38;
  
  script_tags[0] = 0;
  script_tags[1] = 0;
  script_tags[2] = 0;
  script_tags[3] = 0;
  if (gstyles == (FT_UShort *)0x0 ||
      (style_class == (AF_StyleClass)0x0 || globals == (AF_FaceGlobals)0x0)) {
    return 6;
  }
  uVar4 = hb_font_get_face(globals->hb_font);
  phVar2 = coverages[style_class->coverage];
  hb_ot_tags_from_script(scripts[style_class->script],script_tags,script_tags + 1);
  if (default_script == '\0') {
    if (script_tags[0] == 0x44464c54) {
      local_70 = 0;
      uVar7 = 0;
      uVar6 = 0;
      uVar5 = 0;
      goto LAB_001798e3;
    }
    if (script_tags[1] == 0x44464c54) {
      script_tags._0_8_ = script_tags._0_8_ & 0xffffffff;
    }
  }
  else if (script_tags[0] == 0) {
    script_tags[0] = 0x44464c54;
  }
  else if (script_tags[1] != 0x44464c54) {
    if (script_tags[1] == 0) {
      script_tags[1] = 0x44464c54;
    }
    else {
      script_tags[2] = 0x44464c54;
    }
  }
  uVar5 = hb_set_create();
  local_70 = 0;
  hb_ot_layout_collect_lookups(uVar4,0x47535542,script_tags,0,phVar2,uVar5);
  iVar3 = hb_set_is_empty(uVar5);
  if (iVar3 == 0) {
    uVar6 = hb_set_create();
    idx = 0xffffffff;
    while (iVar3 = hb_set_next(uVar5,&idx), iVar3 != 0) {
      hb_ot_layout_lookup_collect_glyphs(uVar4,0x47535542,idx,0,0,0,uVar6);
    }
    local_70 = hb_set_create();
    hb_ot_layout_collect_lookups(uVar4,0x47504f53,script_tags,0,phVar2,local_70);
    uVar7 = hb_set_create();
    idx = 0xffffffff;
    while (iVar3 = hb_set_next(local_70,&idx), iVar3 != 0) {
      hb_ot_layout_lookup_collect_glyphs(uVar4,0x47504f53,idx,0,uVar7,0,0);
    }
    if (style_class->coverage != AF_COVERAGE_DEFAULT) {
      local_50 = 0;
      pAVar8 = af_blue_stringsets + style_class->blue_stringset;
      local_48 = style_class;
      local_40 = gstyles;
      while (gstyles = local_40, style_class = local_48, (ulong)pAVar8->string != 0x1429) {
        pbVar13 = (byte *)(af_blue_strings + pAVar8->string);
        local_38 = pAVar8;
LAB_001797c3:
        bVar1 = *pbVar13;
        uVar11 = (uint)bVar1;
        if (bVar1 != 0) {
          pbVar13 = pbVar13 + 1;
          if ((char)bVar1 < '\0') {
            uVar11 = (uint)(bVar1 < 0xf0) * 8 + 7;
            if (bVar1 < 0xe0) {
              uVar11 = 0x1f;
            }
            uVar10 = (ulong)(bVar1 < 0xf0 ^ 3);
            if (bVar1 < 0xe0) {
              uVar10 = 1;
            }
            uVar11 = bVar1 & uVar11;
            for (lVar12 = 0; (int)uVar10 != (int)lVar12; lVar12 = lVar12 + 1) {
              uVar11 = uVar11 << 6 | pbVar13[lVar12] & 0x3f;
            }
            pbVar13 = pbVar13 + uVar10;
          }
          idx = 0xffffffff;
          do {
            iVar3 = hb_set_next(uVar5,&idx);
            if (iVar3 == 0) goto LAB_001797c3;
            gidx = FT_Get_Char_Index(globals->face,(ulong)uVar11);
            uVar9 = hb_ot_layout_lookup_would_substitute(uVar4,idx,&gidx,1,1);
          } while ((int)uVar9 == 0);
          local_50 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          goto LAB_001797c3;
        }
        pAVar8 = local_38 + 1;
      }
      if ((char)local_50 == '\0') goto LAB_001798e3;
      if (local_48->coverage != AF_COVERAGE_DEFAULT) {
        hb_set_subtract(uVar6,uVar7);
      }
    }
    idx = 0xffffffff;
    while (iVar3 = hb_set_next(uVar6,&idx), iVar3 != 0) {
      if ((idx < (uint)globals->glyph_count) && (gstyles[idx] == 0x3fff)) {
        gstyles[idx] = (short)style_class->style;
      }
    }
  }
  else {
    uVar7 = 0;
    uVar6 = 0;
  }
LAB_001798e3:
  hb_set_destroy(uVar5);
  hb_set_destroy(uVar6);
  hb_set_destroy(local_70);
  hb_set_destroy(uVar7);
  return 0;
}

Assistant:

FT_Error
  af_shaper_get_coverage( AF_FaceGlobals  globals,
                          AF_StyleClass   style_class,
                          FT_UShort*      gstyles,
                          FT_Bool         default_script )
  {
    hb_face_t*  face;

    hb_set_t*  gsub_lookups = NULL; /* GSUB lookups for a given script */
    hb_set_t*  gsub_glyphs  = NULL; /* glyphs covered by GSUB lookups  */
    hb_set_t*  gpos_lookups = NULL; /* GPOS lookups for a given script */
    hb_set_t*  gpos_glyphs  = NULL; /* glyphs covered by GPOS lookups  */

    hb_script_t      script;
    const hb_tag_t*  coverage_tags;
    hb_tag_t         script_tags[] = { HB_TAG_NONE,
                                       HB_TAG_NONE,
                                       HB_TAG_NONE,
                                       HB_TAG_NONE };

    hb_codepoint_t  idx;
#ifdef FT_DEBUG_LEVEL_TRACE
    int             count;
#endif


    if ( !globals || !style_class || !gstyles )
      return FT_THROW( Invalid_Argument );

    face = hb_font_get_face( globals->hb_font );

    coverage_tags = coverages[style_class->coverage];
    script        = scripts[style_class->script];

    /* Convert a HarfBuzz script tag into the corresponding OpenType */
    /* tag or tags -- some Indic scripts like Devanagari have an old */
    /* and a new set of features.                                    */
    hb_ot_tags_from_script( script,
                            &script_tags[0],
                            &script_tags[1] );

    /* `hb_ot_tags_from_script' usually returns HB_OT_TAG_DEFAULT_SCRIPT */
    /* as the second tag.  We change that to HB_TAG_NONE except for the  */
    /* default script.                                                   */
    if ( default_script )
    {
      if ( script_tags[0] == HB_TAG_NONE )
        script_tags[0] = HB_OT_TAG_DEFAULT_SCRIPT;
      else
      {
        if ( script_tags[1] == HB_TAG_NONE )
          script_tags[1] = HB_OT_TAG_DEFAULT_SCRIPT;
        else if ( script_tags[1] != HB_OT_TAG_DEFAULT_SCRIPT )
          script_tags[2] = HB_OT_TAG_DEFAULT_SCRIPT;
      }
    }
    else
    {
      /* we use non-standard tags like `khms' for special purposes;       */
      /* HarfBuzz maps them to `DFLT', which we don't want to handle here */
      if ( script_tags[0] == HB_OT_TAG_DEFAULT_SCRIPT )
        goto Exit;

      if ( script_tags[1] == HB_OT_TAG_DEFAULT_SCRIPT )
        script_tags[1] = HB_TAG_NONE;
    }

    gsub_lookups = hb_set_create();
    hb_ot_layout_collect_lookups( face,
                                  HB_OT_TAG_GSUB,
                                  script_tags,
                                  NULL,
                                  coverage_tags,
                                  gsub_lookups );

    if ( hb_set_is_empty( gsub_lookups ) )
      goto Exit; /* nothing to do */

    FT_TRACE4(( "GSUB lookups (style `%s'):\n"
                " ",
                af_style_names[style_class->style] ));

#ifdef FT_DEBUG_LEVEL_TRACE
    count = 0;
#endif

    gsub_glyphs = hb_set_create();
    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_lookups, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* get output coverage of GSUB feature */
      hb_ot_layout_lookup_collect_glyphs( face,
                                          HB_OT_TAG_GSUB,
                                          idx,
                                          NULL,
                                          NULL,
                                          NULL,
                                          gsub_glyphs );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( " (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

    FT_TRACE4(( "GPOS lookups (style `%s'):\n"
                " ",
                af_style_names[style_class->style] ));

    gpos_lookups = hb_set_create();
    hb_ot_layout_collect_lookups( face,
                                  HB_OT_TAG_GPOS,
                                  script_tags,
                                  NULL,
                                  coverage_tags,
                                  gpos_lookups );

#ifdef FT_DEBUG_LEVEL_TRACE
    count = 0;
#endif

    gpos_glyphs = hb_set_create();
    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gpos_lookups, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* get input coverage of GPOS feature */
      hb_ot_layout_lookup_collect_glyphs( face,
                                          HB_OT_TAG_GPOS,
                                          idx,
                                          NULL,
                                          gpos_glyphs,
                                          NULL,
                                          NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( " (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

    /*
     * We now check whether we can construct blue zones, using glyphs
     * covered by the feature only.  In case there is not a single zone
     * (this is, not a single character is covered), we skip this coverage.
     *
     */
    if ( style_class->coverage != AF_COVERAGE_DEFAULT )
    {
      AF_Blue_Stringset         bss = style_class->blue_stringset;
      const AF_Blue_StringRec*  bs  = &af_blue_stringsets[bss];

      FT_Bool  found = 0;


      for ( ; bs->string != AF_BLUE_STRING_MAX; bs++ )
      {
        const char*  p = &af_blue_strings[bs->string];


        while ( *p )
        {
          hb_codepoint_t  ch;


          GET_UTF8_CHAR( ch, p );

          for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_lookups,
                                                         &idx ); )
          {
            hb_codepoint_t  gidx = FT_Get_Char_Index( globals->face, ch );


            if ( hb_ot_layout_lookup_would_substitute( face, idx,
                                                       &gidx, 1, 1 ) )
            {
              found = 1;
              break;
            }
          }
        }
      }

      if ( !found )
      {
        FT_TRACE4(( "  no blue characters found; style skipped\n" ));
        goto Exit;
      }
    }

    /*
     * Various OpenType features might use the same glyphs at different
     * vertical positions; for example, superscript and subscript glyphs
     * could be the same.  However, the auto-hinter is completely
     * agnostic of OpenType features after the feature analysis has been
     * completed: The engine then simply receives a glyph index and returns a
     * hinted and usually rendered glyph.
     *
     * Consider the superscript feature of font `pala.ttf': Some of the
     * glyphs are `real', this is, they have a zero vertical offset, but
     * most of them are small caps glyphs shifted up to the superscript
     * position (this is, the `sups' feature is present in both the GSUB and
     * GPOS tables).  The code for blue zones computation actually uses a
     * feature's y offset so that the `real' glyphs get correct hints.  But
     * later on it is impossible to decide whether a glyph index belongs to,
     * say, the small caps or superscript feature.
     *
     * For this reason, we don't assign a style to a glyph if the current
     * feature covers the glyph in both the GSUB and the GPOS tables.  This
     * is quite a broad condition, assuming that
     *
     *   (a) glyphs that get used in multiple features are present in a
     *       feature without vertical shift,
     *
     * and
     *
     *   (b) a feature's GPOS data really moves the glyph vertically.
     *
     * Not fulfilling condition (a) makes a font larger; it would also
     * reduce the number of glyphs that could be addressed directly without
     * using OpenType features, so this assumption is rather strong.
     *
     * Condition (b) is much weaker, and there might be glyphs which get
     * missed.  However, the OpenType features we are going to handle are
     * primarily located in GSUB, and HarfBuzz doesn't provide an API to
     * directly get the necessary information from the GPOS table.  A
     * possible solution might be to directly parse the GPOS table to find
     * out whether a glyph gets shifted vertically, but this is something I
     * would like to avoid if not really necessary.
     *
     * Note that we don't follow this logic for the default coverage.
     * Complex scripts like Devanagari have mandatory GPOS features to
     * position many glyph elements, using mark-to-base or mark-to-ligature
     * tables; the number of glyphs missed due to condition (b) would be far
     * too large.
     *
     */
    if ( style_class->coverage != AF_COVERAGE_DEFAULT )
      hb_set_subtract( gsub_glyphs, gpos_glyphs );

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE4(( "  glyphs without GPOS data (`*' means already assigned)" ));
    count = 0;
#endif

    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_glyphs, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( !( count % 10 ) )
        FT_TRACE4(( "\n"
                    "   " ));

      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* glyph indices returned by `hb_ot_layout_lookup_collect_glyphs' */
      /* can be arbitrary: some fonts use fake indices for processing   */
      /* internal to GSUB or GPOS, which is fully valid                 */
      if ( idx >= (hb_codepoint_t)globals->glyph_count )
        continue;

      if ( gstyles[idx] == AF_STYLE_UNASSIGNED )
        gstyles[idx] = (FT_UShort)style_class->style;
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE4(( "*" ));
#endif
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( "\n"
                  "    (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

  Exit:
    hb_set_destroy( gsub_lookups );
    hb_set_destroy( gsub_glyphs  );
    hb_set_destroy( gpos_lookups );
    hb_set_destroy( gpos_glyphs  );

    return FT_Err_Ok;
  }